

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined4 uVar8;
  float afStack_7c [5];
  Matrix<float,_2,_4> res;
  int local_40 [6];
  Type in0;
  
  pfVar1 = (float *)&in0;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar8;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in0.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[3] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &s_constInMat2x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 == 4);
      lVar3 = lVar3 + 1;
      pfVar1 = pfVar1 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 4);
  }
  pfVar1 = (float *)&res;
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  res.m_data.m_data[3].m_data[0] = 0.0;
  res.m_data.m_data[3].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar8 = 0;
      }
      pfVar1[lVar5 * 2] = (float)uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pfVar1 = pfVar1 + 1;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  pVVar2 = (Vector<float,_2> *)&res;
  pfVar1 = (float *)&in0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)((Vector<tcu::Vector<float,_2>,_4> *)pVVar2->m_data)->m_data[0].m_data +
                lVar5) = pfVar1[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    lVar3 = lVar3 + 1;
    pVVar2 = pVVar2 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 4);
  afStack_7c[2] =
       res.m_data.m_data[0].m_data[0] + res.m_data.m_data[0].m_data[1] +
       res.m_data.m_data[3].m_data[0];
  afStack_7c[3] =
       res.m_data.m_data[1].m_data[0] + res.m_data.m_data[1].m_data[1] +
       res.m_data.m_data[3].m_data[1];
  afStack_7c[4] = res.m_data.m_data[2].m_data[0] + res.m_data.m_data[2].m_data[1];
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar3]] = afStack_7c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}